

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O2

void av1_compute_stats_highbd_avx2
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  uint16_t *puVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  uint16_t *puVar5;
  undefined1 auVar6 [32];
  uint16_t uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int64_t *piVar21;
  int64_t *piVar22;
  int iVar23;
  ulong uVar24;
  int *piVar25;
  undefined1 *puVar26;
  long lVar27;
  int *piVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  long lVar31;
  long lVar32;
  undefined1 auVar33 [16];
  __m256i dgd_ijkl;
  int32_t sumY [7] [7];
  int64_t M_int [7] [7];
  int64_t H_int [49] [56];
  long local_5a48;
  undefined1 *local_5a38;
  undefined1 *local_5a30;
  long local_59c0;
  long local_59b8;
  int64_t *local_5990;
  long local_5988;
  long local_5980;
  long local_5978;
  long local_5970;
  long local_5938;
  long local_5918;
  long local_5910;
  __m256i local_5900;
  long local_58c8;
  __m256i local_58c0;
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined1 local_5820 [32];
  undefined1 local_5800 [32];
  undefined4 local_57e0;
  undefined1 local_57c0 [32];
  undefined1 local_57a0 [32];
  undefined1 local_5780 [32];
  undefined1 local_5760 [32];
  undefined1 local_5740 [32];
  undefined1 local_5720 [32];
  undefined8 local_5700;
  undefined1 local_5620 [22000];
  
  local_5990 = H;
  lVar16 = (long)dgd_stride;
  if (wiener_win == 5) {
    puVar5 = (uint16_t *)((long)dgd8 * 2);
    uVar7 = find_average_highbd(puVar5,h_start,h_end,v_start,v_end,dgd_stride);
    local_5740 = ZEXT1632(ZEXT816(0) << 0x40);
    local_57c0 = ZEXT1632(ZEXT816(0) << 0x40);
    local_5700 = 0;
    iVar10 = 0;
    local_57a0 = local_57c0;
    local_5780 = local_57c0;
    local_5760 = local_57c0;
    local_5720 = local_5740;
    memset(local_5620,0,8000);
    auVar33 = ZEXT816(0) << 0x40;
    local_5860 = ZEXT1632(auVar33);
    auVar6._28_4_ = 0;
    auVar6._0_28_ = local_5840._4_28_;
    local_5840 = auVar6 << 0x20;
    local_5880 = ZEXT1632(auVar33);
    local_58a0 = ZEXT1632(auVar33);
    lVar11 = (long)(dgd_stride * 2);
    local_58c0[2] = _DAT_00b98050;
    local_58c0[3] = _UNK_00b98058;
    local_58c0[0] = _DAT_00b98050;
    local_58c0[1] = _UNK_00b98058;
    lVar27 = (long)v_start;
    local_5980 = (long)h_start * 2 + lVar16 * lVar27 * 2 + lVar11 * -2 + (long)dgd8 * 2 + -4;
    lVar19 = lVar16 * 2;
    local_5988 = lVar16 * lVar27 * 2 + lVar11 * -2 + (long)dgd8 * 2 + -4;
    while( true ) {
      iVar23 = (int)lVar27;
      iVar8 = v_end - iVar23;
      if (iVar8 == 0 || v_end < iVar23) break;
      if (0x3f < iVar8) {
        iVar8 = 0x40;
      }
      local_59c0 = local_5988;
      local_59b8 = local_5980;
      for (lVar18 = lVar27; lVar18 < iVar8 + iVar23; lVar18 = lVar18 + 1) {
        lVar15 = (long)src8 * 2 + lVar18 * src_stride * 2;
        lVar14 = local_59b8;
        iVar13 = h_start;
        for (lVar17 = (long)h_start; lVar17 < (int)(h_end & 0xfffffffe); lVar17 = lVar17 + 2) {
          uVar12 = (uint)*(ushort *)(lVar15 + lVar17 * 2);
          uVar9 = (uint)*(ushort *)(lVar15 + 2 + lVar17 * 2);
          puVar1 = puVar5 + ((lVar18 * lVar16 + lVar17 + -2) - lVar11);
          puVar29 = local_5620;
          local_5a30 = local_58a0;
          local_5a38 = local_57c0;
          local_5a48 = lVar14;
          for (lVar20 = 0; lVar20 != 5; lVar20 = lVar20 + 1) {
            lVar32 = 0;
            for (lVar31 = 0; lVar31 != 8000; lVar31 = lVar31 + 0x640) {
              uVar3 = *(ushort *)(local_5a48 + lVar32);
              uVar4 = *(ushort *)(local_5a48 + 2 + lVar32);
              *(uint *)(local_5a30 + lVar32 * 2) =
                   *(int *)(local_5a30 + lVar32 * 2) + (uint)uVar4 + (uint)uVar3;
              *(ulong *)(local_5a38 + lVar32 * 4) =
                   *(long *)(local_5a38 + lVar32 * 4) + (ulong)(uVar4 * uVar9 + uVar3 * uVar12);
              uVar2 = *(undefined4 *)(local_5a48 + lVar32);
              local_5900[0]._4_4_ = uVar2;
              local_5900[0]._0_4_ = uVar2;
              local_5900[1]._0_4_ = uVar2;
              local_5900[1]._4_4_ = uVar2;
              local_5900[2]._0_4_ = uVar2;
              local_5900[2]._4_4_ = uVar2;
              local_5900[3]._0_4_ = uVar2;
              local_5900[3]._4_4_ = uVar2;
              acc_stat_highbd_avx2((int64_t *)(puVar29 + lVar31),puVar1,&local_58c0,&local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar31 + 0x40),puVar1 + lVar16,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar31 + 0x80),puVar1 + lVar11,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar31 + 0xc0),puVar1 + dgd_stride * 3,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar31 + 0x100),puVar1 + dgd_stride * 4,&local_58c0,
                         &local_5900);
              lVar32 = lVar32 + 2;
            }
            local_5a38 = local_5a38 + 0x28;
            local_5a30 = local_5a30 + 0x14;
            local_5a48 = local_5a48 + lVar19;
            puVar29 = puVar29 + 0x140;
          }
          iVar10 = iVar10 + uVar12 + uVar9;
          lVar14 = lVar14 + 4;
          iVar13 = iVar13 + 2;
        }
        if ((h_end & 1U) != 0) {
          uVar9 = (uint)*(ushort *)(lVar15 + (long)(int)lVar17 * 2);
          puVar1 = puVar5 + ((lVar18 * lVar16 + (long)(int)lVar17 + -2) - lVar11);
          local_5a48 = local_59c0 + (long)iVar13 * 2;
          puVar29 = local_5620;
          local_5a30 = local_58a0;
          local_5a38 = local_57c0;
          for (lVar15 = 0; lVar15 != 5; lVar15 = lVar15 + 1) {
            lVar17 = 0;
            for (lVar14 = 0; lVar14 != 8000; lVar14 = lVar14 + 0x640) {
              uVar3 = *(ushort *)(local_5a48 + lVar17);
              *(uint *)(local_5a30 + lVar17 * 2) = *(int *)(local_5a30 + lVar17 * 2) + (uint)uVar3;
              *(ulong *)(local_5a38 + lVar17 * 4) =
                   *(long *)(local_5a38 + lVar17 * 4) + (ulong)(uVar3 * uVar9);
              local_5900[0] = (ulong)CONCAT24(uVar3,(uint)uVar3);
              local_5900[1]._0_2_ = uVar3;
              local_5900[1]._2_2_ = 0;
              local_5900[1]._4_2_ = uVar3;
              local_5900[1]._6_2_ = 0;
              local_5900[2]._0_2_ = uVar3;
              local_5900[2]._2_2_ = 0;
              local_5900[2]._4_2_ = uVar3;
              local_5900[2]._6_2_ = 0;
              local_5900[3]._0_2_ = uVar3;
              local_5900[3]._2_2_ = 0;
              local_5900[3]._4_2_ = uVar3;
              local_5900[3]._6_2_ = 0;
              acc_stat_highbd_avx2((int64_t *)(puVar29 + lVar14),puVar1,&local_58c0,&local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0x40),puVar1 + lVar16,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0x80),puVar1 + lVar11,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0xc0),puVar1 + dgd_stride * 3,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0x100),puVar1 + dgd_stride * 4,&local_58c0,
                         &local_5900);
              lVar17 = lVar17 + 2;
            }
            local_5a38 = local_5a38 + 0x28;
            local_5a30 = local_5a30 + 0x14;
            local_5a48 = local_5a48 + lVar19;
            puVar29 = puVar29 + 0x140;
          }
          iVar10 = iVar10 + uVar9;
        }
        local_59b8 = local_59b8 + lVar19;
        local_59c0 = local_59c0 + lVar19;
      }
      lVar27 = lVar27 + 0x40;
      local_5980 = local_5980 + lVar16 * 0x80;
      local_5988 = local_5988 + lVar16 * 0x80;
    }
    lVar16 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar16 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar24 = (ulong)uVar7;
    lVar11 = uVar24 * uVar24 * (long)((h_end - h_start) * (v_end - v_start));
    puVar29 = local_5620;
    for (lVar19 = 0; lVar19 != 5; lVar19 = lVar19 + 1) {
      piVar21 = local_5990;
      puVar26 = puVar29;
      for (lVar27 = 0; lVar27 != 5; lVar27 = lVar27 + 1) {
        iVar8 = *(int *)(local_58a0 + lVar27 * 4 + lVar19 * 0x14);
        M[lVar27 * 5 + lVar19] =
             (long)((*(long *)(local_57c0 + lVar27 * 8 + lVar19 * 0x28) + lVar11) -
                   ((long)iVar10 + (long)iVar8) * uVar24) / lVar16;
        piVar25 = (int *)local_58a0;
        piVar22 = piVar21;
        puVar30 = puVar26;
        for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
          piVar28 = piVar25;
          for (lVar15 = 0; lVar15 != 0x28; lVar15 = lVar15 + 8) {
            *(long *)((long)piVar22 + lVar15) =
                 (long)((*(long *)(puVar30 + lVar15 * 8) + lVar11) -
                       ((long)*piVar28 + (long)iVar8) * uVar24) / lVar16;
            piVar28 = piVar28 + 5;
          }
          puVar30 = puVar30 + 8;
          piVar22 = piVar22 + 5;
          piVar25 = piVar25 + 1;
        }
        puVar26 = puVar26 + 0x640;
        piVar21 = piVar21 + 0x7d;
      }
      puVar29 = puVar29 + 0x140;
      local_5990 = local_5990 + 0x19;
    }
  }
  else if (wiener_win == 7) {
    lVar27 = (long)v_start;
    puVar5 = (uint16_t *)((long)dgd8 * 2);
    uVar7 = find_average_highbd(puVar5,h_start,h_end,v_start,v_end,dgd_stride);
    iVar10 = 0;
    memset(local_57c0,0,0x188);
    memset(local_5620,0,0x55c0);
    auVar33 = ZEXT816(0) << 0x40;
    local_5800 = ZEXT1632(auVar33);
    local_5820 = ZEXT1632(auVar33);
    local_5840 = ZEXT1632(auVar33);
    local_5860 = local_5840;
    local_5880 = local_5840;
    local_58a0 = local_5840;
    local_57e0 = 0;
    lVar11 = (long)(dgd_stride * 3);
    local_58c0[2] = _DAT_00b98050;
    local_58c0[3] = _UNK_00b98058;
    local_58c0[0] = _DAT_00b98050;
    local_58c0[1] = _UNK_00b98058;
    local_5910 = (long)h_start * 2 + lVar16 * lVar27 * 2 + lVar11 * -2 + (long)dgd8 * 2 + -6;
    local_58c8 = lVar16 << 7;
    lVar19 = lVar16 * 2;
    local_5918 = lVar16 * lVar27 * 2 + lVar11 * -2 + (long)dgd8 * 2 + -6;
    while( true ) {
      iVar23 = (int)lVar27;
      iVar8 = v_end - iVar23;
      if (iVar8 == 0 || v_end < iVar23) break;
      if (0x3f < iVar8) {
        iVar8 = 0x40;
      }
      local_5978 = local_5918;
      local_5970 = local_5910;
      for (lVar18 = lVar27; lVar18 < iVar8 + iVar23; lVar18 = lVar18 + 1) {
        lVar15 = (long)src8 * 2 + lVar18 * src_stride * 2;
        local_5938 = local_5970;
        iVar13 = h_start;
        for (lVar17 = (long)h_start; lVar17 < (int)(h_end & 0xfffffffe); lVar17 = lVar17 + 2) {
          uVar12 = (uint)*(ushort *)(lVar15 + lVar17 * 2);
          uVar9 = (uint)*(ushort *)(lVar15 + 2 + lVar17 * 2);
          puVar1 = puVar5 + ((lVar18 * lVar16 + lVar17 + -3) - lVar11);
          puVar29 = local_5620;
          local_5a48 = local_5938;
          local_5a30 = local_58a0;
          local_5a38 = local_57c0;
          for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
            lVar31 = 0;
            for (lVar20 = 0; lVar20 != 0x55c0; lVar20 = lVar20 + 0xc40) {
              uVar3 = *(ushort *)(local_5a48 + lVar31);
              uVar4 = *(ushort *)(local_5a48 + 2 + lVar31);
              *(uint *)(local_5a30 + lVar31 * 2) =
                   *(int *)(local_5a30 + lVar31 * 2) + (uint)uVar4 + (uint)uVar3;
              *(ulong *)(local_5a38 + lVar31 * 4) =
                   *(long *)(local_5a38 + lVar31 * 4) + (ulong)(uVar4 * uVar9 + uVar3 * uVar12);
              uVar2 = *(undefined4 *)(local_5a48 + lVar31);
              local_5900[0]._4_4_ = uVar2;
              local_5900[0]._0_4_ = uVar2;
              local_5900[1]._0_4_ = uVar2;
              local_5900[1]._4_4_ = uVar2;
              local_5900[2]._0_4_ = uVar2;
              local_5900[2]._4_4_ = uVar2;
              local_5900[3]._0_4_ = uVar2;
              local_5900[3]._4_4_ = uVar2;
              acc_stat_highbd_avx2((int64_t *)(puVar29 + lVar20),puVar1,&local_58c0,&local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar20 + 0x40),puVar1 + lVar16,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar20 + 0x80),puVar1 + dgd_stride * 2,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar20 + 0xc0),puVar1 + lVar11,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar20 + 0x100),puVar1 + dgd_stride * 4,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar20 + 0x140),puVar1 + dgd_stride * 5,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar20 + 0x180),puVar1 + dgd_stride * 6,&local_58c0,
                         &local_5900);
              lVar31 = lVar31 + 2;
            }
            local_5a38 = local_5a38 + 0x38;
            local_5a30 = local_5a30 + 0x1c;
            local_5a48 = local_5a48 + lVar19;
            puVar29 = puVar29 + 0x1c0;
          }
          iVar10 = iVar10 + uVar12 + uVar9;
          local_5938 = local_5938 + 4;
          iVar13 = iVar13 + 2;
        }
        if ((h_end & 1U) != 0) {
          uVar9 = (uint)*(ushort *)(lVar15 + (long)(int)lVar17 * 2);
          puVar1 = puVar5 + ((lVar18 * lVar16 + (long)(int)lVar17 + -3) - lVar11);
          local_5a48 = local_5978 + (long)iVar13 * 2;
          puVar29 = local_5620;
          local_5a30 = local_58a0;
          local_5a38 = local_57c0;
          for (lVar15 = 0; lVar15 != 7; lVar15 = lVar15 + 1) {
            lVar17 = 0;
            for (lVar14 = 0; lVar14 != 0x55c0; lVar14 = lVar14 + 0xc40) {
              uVar3 = *(ushort *)(local_5a48 + lVar17);
              *(uint *)(local_5a30 + lVar17 * 2) = *(int *)(local_5a30 + lVar17 * 2) + (uint)uVar3;
              *(ulong *)(local_5a38 + lVar17 * 4) =
                   *(long *)(local_5a38 + lVar17 * 4) + (ulong)(uVar3 * uVar9);
              local_5900[0] = (ulong)CONCAT24(uVar3,(uint)uVar3);
              local_5900[1]._0_2_ = uVar3;
              local_5900[1]._2_2_ = 0;
              local_5900[1]._4_2_ = uVar3;
              local_5900[1]._6_2_ = 0;
              local_5900[2]._0_2_ = uVar3;
              local_5900[2]._2_2_ = 0;
              local_5900[2]._4_2_ = uVar3;
              local_5900[2]._6_2_ = 0;
              local_5900[3]._0_2_ = uVar3;
              local_5900[3]._2_2_ = 0;
              local_5900[3]._4_2_ = uVar3;
              local_5900[3]._6_2_ = 0;
              acc_stat_highbd_avx2((int64_t *)(puVar29 + lVar14),puVar1,&local_58c0,&local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0x40),puVar1 + lVar16,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0x80),puVar1 + dgd_stride * 2,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0xc0),puVar1 + lVar11,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0x100),puVar1 + dgd_stride * 4,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0x140),puVar1 + dgd_stride * 5,&local_58c0,
                         &local_5900);
              acc_stat_highbd_avx2
                        ((int64_t *)(puVar29 + lVar14 + 0x180),puVar1 + dgd_stride * 6,&local_58c0,
                         &local_5900);
              lVar17 = lVar17 + 2;
            }
            local_5a38 = local_5a38 + 0x38;
            local_5a30 = local_5a30 + 0x1c;
            local_5a48 = local_5a48 + lVar19;
            puVar29 = puVar29 + 0x1c0;
          }
          iVar10 = iVar10 + uVar9;
        }
        local_5970 = local_5970 + lVar19;
        local_5978 = local_5978 + lVar19;
      }
      lVar27 = lVar27 + 0x40;
      local_5910 = local_5910 + local_58c8;
      local_5918 = local_5918 + local_58c8;
    }
    lVar16 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar16 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar24 = (ulong)uVar7;
    lVar11 = uVar24 * uVar24 * (long)((h_end - h_start) * (v_end - v_start));
    puVar29 = local_5620;
    for (lVar19 = 0; lVar19 != 7; lVar19 = lVar19 + 1) {
      piVar21 = local_5990;
      puVar26 = puVar29;
      for (lVar27 = 0; lVar27 != 7; lVar27 = lVar27 + 1) {
        iVar8 = *(int *)(local_58a0 + lVar27 * 4 + lVar19 * 0x1c);
        M[lVar27 * 7 + lVar19] =
             (long)((*(long *)(local_57c0 + lVar27 * 8 + lVar19 * 0x38) + lVar11) -
                   ((long)iVar10 + (long)iVar8) * uVar24) / lVar16;
        piVar25 = (int *)local_58a0;
        piVar22 = piVar21;
        puVar30 = puVar26;
        for (lVar18 = 0; lVar18 != 7; lVar18 = lVar18 + 1) {
          piVar28 = piVar25;
          for (lVar15 = 0; lVar15 != 0x38; lVar15 = lVar15 + 8) {
            *(long *)((long)piVar22 + lVar15) =
                 (long)((*(long *)(puVar30 + lVar15 * 8) + lVar11) -
                       ((long)*piVar28 + (long)iVar8) * uVar24) / lVar16;
            piVar28 = piVar28 + 7;
          }
          puVar30 = puVar30 + 8;
          piVar22 = piVar22 + 7;
          piVar25 = piVar25 + 1;
        }
        puVar26 = puVar26 + 0xc40;
        piVar21 = piVar21 + 0x157;
      }
      puVar29 = puVar29 + 0x1c0;
      local_5990 = local_5990 + 0x31;
    }
  }
  else {
    av1_compute_stats_highbd_c
              (wiener_win,dgd8,src8,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
               src_stride,M,H,bit_depth);
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_avx2(int wiener_win, const uint8_t *dgd8,
                                   const uint8_t *src8, int16_t *dgd_avg,
                                   int16_t *src_avg, int h_start, int h_end,
                                   int v_start, int v_end, int dgd_stride,
                                   int src_stride, int64_t *M, int64_t *H,
                                   aom_bit_depth_t bit_depth) {
  if (wiener_win == WIENER_WIN) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win7_opt_avx2(dgd8, src8, h_start, h_end, v_start,
                                       v_end, dgd_stride, src_stride, M, H,
                                       bit_depth);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win5_opt_avx2(dgd8, src8, h_start, h_end, v_start,
                                       v_end, dgd_stride, src_stride, M, H,
                                       bit_depth);
  } else {
    av1_compute_stats_highbd_c(wiener_win, dgd8, src8, dgd_avg, src_avg,
                               h_start, h_end, v_start, v_end, dgd_stride,
                               src_stride, M, H, bit_depth);
  }
}